

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::epsZero(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  element_type *this_00;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  undefined1 *val;
  undefined1 local_48 [16];
  cpp_dec_float<50U,_int,_void> *local_38 [3];
  undefined8 local_20;
  cpp_dec_float<50U,_int,_void> **local_18;
  cpp_dec_float<50U,_int,_void> **local_8;
  
  val = local_48;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_RDI);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4235f8);
  local_38[0] = (cpp_dec_float<50U,_int,_void> *)Tolerances::epsilon(this_00);
  local_18 = local_38;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (local_38[0],(double)val,in_RDI);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x42365f);
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

R epsZero() const
   {
      return this->tolerances()->epsilon();
   }